

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_MNI_MultiEntryImportExplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_MultiEntryImportExplicitNetworkPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  element_type *this_00;
  bool bVar1;
  CommissionerAppMock *this_01;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  TypedExpectation<bool_()> *pTVar2;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_03;
  string *this_04;
  _Any_data *this_05;
  char *expected_predicate_value;
  char *pcVar3;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_512;
  allocator local_511;
  allocator local_510;
  allocator local_50f;
  allocator local_50e;
  allocator local_50d;
  allocator local_50c;
  allocator local_50b;
  allocator local_50a;
  Status local_509;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Expression expr;
  _Any_data local_448;
  code *local_438;
  code *pcStack_430;
  CommissionerAppMockPtr commissionerAppMock;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_408;
  Registry *local_3e8;
  State local_3e0;
  State local_3dc;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  string local_3b8;
  string local_398;
  UnixTime local_378;
  UnixTime local_370;
  string mepdsFileName;
  Value value;
  string multiEntryPendingDataset;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  std::__cxx11::string::string
            ((string *)&multiEntryPendingDataset,
             "\n{\n  \"1122334455667788\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  },\n  \"99AABBCCDDEEFF00\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n    \"NetworkName\": \"net9\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  }\n}"
             ,(allocator *)&value);
  std::__cxx11::string::string((string *)&mepdsFileName,"./mepds.json",(allocator *)&value);
  ot::commissioner::WriteFile(&value.mError,&multiEntryPendingDataset,&mepdsFileName);
  gtest_ar_._0_4_ = value.mError.mCode;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",(ErrorCode *)&gtest_ar_,(ErrorCode *)&expr);
  std::__cxx11::string::~string((string *)&value.mError.mMessage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xba8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&value);
    this_04 = (string *)&gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&gtest_ar);
    if ((undefined1)value.mError.mCode == kNone) {
      testing::Message::Message((Message *)&gtest_ar);
      if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xbaa,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
      this_04 = &value.mError.mMessage;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&value.mError.mMessage);
      local_3e8 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&gtest_ar,"127.0.0.1",&local_50a);
      local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&gtest_ar_,"1.1",&local_50b);
      ot::commissioner::BorderAgent::State::State(&local_3dc,0,0,0,0,0);
      std::__cxx11::string::string((string *)&expr,"net1",&local_50c);
      std::__cxx11::string::string((string *)local_488,"",&local_50d);
      std::__cxx11::string::string((string *)local_448._M_pod_data,"",&local_50e);
      std::__cxx11::string::string((string *)local_3d8._M_pod_data,"",&local_50f);
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string((string *)&local_398,"domain1",&local_510);
      pcVar3 = "";
      std::__cxx11::string::string((string *)&local_3b8,"",&local_511);
      ot::commissioner::UnixTime::UnixTime(&local_370,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&gtest_ar,0x4e21,(ByteArray *)&local_408,
                 (string *)&gtest_ar_,local_3dc,(string *)&expr,0x1122334455667788,
                 (string *)local_488,(string *)&local_448,(Timestamp)0x0,0,(string *)&local_3d8,
                 (ByteArray *)&commissionerAppMock,&local_398,'\0',0,&local_3b8,local_370,0x101f);
      local_509 = ot::commissioner::persistent_storage::Registry::Add
                            (local_3e8,(BorderAgent *)&value);
      local_512 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_2,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_509,&local_512);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&commissionerAppMock
                );
      std::__cxx11::string::~string((string *)local_3d8._M_pod_data);
      std::__cxx11::string::~string((string *)local_448._M_pod_data);
      std::__cxx11::string::~string((string *)local_488);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&value);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xbae,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&value);
        this_04 = (string *)&gtest_ar_2.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
        local_3e8 = ctx.mRegistry;
        std::__cxx11::string::string((string *)&gtest_ar,"127.0.0.2",&local_50a);
        local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&gtest_ar_,"1.1",&local_50b);
        ot::commissioner::BorderAgent::State::State(&local_3e0,0,0,0,0,0);
        std::__cxx11::string::string((string *)&expr,"net2",&local_50c);
        std::__cxx11::string::string((string *)local_488,"",&local_50d);
        std::__cxx11::string::string((string *)local_448._M_pod_data,"",&local_50e);
        std::__cxx11::string::string((string *)local_3d8._M_pod_data,"",&local_50f);
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__cxx11::string::string((string *)&local_398,"domain2",&local_510);
        pcVar3 = "";
        std::__cxx11::string::string((string *)&local_3b8,"",&local_511);
        ot::commissioner::UnixTime::UnixTime(&local_378,0);
        expected_predicate_value = (char *)(ulong)(uint)local_3e0;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)&gtest_ar,0x4e22,(ByteArray *)&local_408,
                   (string *)&gtest_ar_,local_3e0,(string *)&expr,0x99aabbccddeeff00,
                   (string *)local_488,(string *)&local_448,(Timestamp)0x0,0,(string *)&local_3d8,
                   (ByteArray *)&commissionerAppMock,&local_398,'\0',0,&local_3b8,local_378,0x101f);
        local_509 = ot::commissioner::persistent_storage::Registry::Add
                              (local_3e8,(BorderAgent *)&value);
        local_512 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&gtest_ar_2,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_509,&local_512);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &commissionerAppMock);
        std::__cxx11::string::~string((string *)local_3d8._M_pod_data);
        std::__cxx11::string::~string((string *)local_448._M_pod_data);
        std::__cxx11::string::~string((string *)local_488);
        std::__cxx11::string::~string((string *)&expr);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar_2.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_2.message_);
          this_01 = (CommissionerAppMock *)operator_new(0x1838);
          memset(this_01,0,0x1838);
          CommissionerAppMock::CommissionerAppMock(this_01);
          std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<CommissionerAppMock,void>
                    ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                     &commissionerAppMock,this_01);
          testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
          testing::A<ot::commissioner::Config_const&>();
          CommissionerAppStaticExpecter::gmock_Create
                    ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *)&gtest_ar,&ctx.mCommissionerAppStaticExpecter,
                     (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_398,
                     (Matcher<const_ot::commissioner::Config_&> *)&local_3b8);
          testing::internal::GetWithoutMatchers();
          this_02 = testing::internal::
                    MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    ::InternalExpectedAt
                              ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                *)&gtest_ar,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xbb5,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
          local_188._0_4_ = kNone;
          local_180._M_p = (pointer)&local_170;
          local_178 = 0;
          local_170._M_local_buf[0] = '\0';
          testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_2,(Error *)local_188);
          std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)&local_408
                     ,(__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                      &gtest_ar_2);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:2999:30)>
                        ::_M_manager;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&commissionerAppMock;
          local_408._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)&commissionerAppMock;
          std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
          std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                    ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                     local_488,
                     (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)&expr)
          ;
          local_438 = (code *)0x0;
          pcStack_430 = (code *)0x0;
          local_448._M_unused._M_object = (void *)0x0;
          local_448._8_8_ = 0;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          local_448._M_unused._M_object = operator_new(0x20);
          *(undefined8 *)local_448._M_unused._0_8_ = 0;
          *(undefined8 *)((long)local_448._M_unused._0_8_ + 8) = 0;
          *(undefined8 *)((long)local_448._M_unused._0_8_ + 0x10) = 0;
          *(undefined8 *)((long)local_448._M_unused._0_8_ + 0x18) = local_478._8_8_;
          if (local_478._M_allocated_capacity != 0) {
            *(undefined8 *)local_448._M_unused._0_8_ = local_488._0_8_;
            *(undefined8 *)((long)local_448._M_unused._0_8_ + 8) = local_488._8_8_;
            *(size_type *)((long)local_448._M_unused._0_8_ + 0x10) = local_478._M_allocated_capacity
            ;
            local_478._M_allocated_capacity = 0;
            local_478._8_8_ = 0;
          }
          local_448._8_8_ =
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          local_438 = std::_Function_handler::operator_cast_to_Action;
          pcStack_430 = std::_Function_handler::operator_cast_to_Action;
          std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
          std::_Function_base::~_Function_base((_Function_base *)local_488);
          std::_Function_base::~_Function_base((_Function_base *)&expr);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_448;
          std::
          vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
          ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                    *)&value,__l,(allocator_type *)&gtest_ar_);
          std::_Function_base::~_Function_base((_Function_base *)&local_448);
          __return_storage_ptr__ = &value.mError.mMessage.field_2;
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *)__return_storage_ptr__,(ReturnAction *)&local_408);
          local_3c8 = (code *)0x0;
          pcStack_3c0 = (code *)0x0;
          local_3d8._M_unused._M_object = (void *)0x0;
          local_3d8._8_8_ = 0;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          local_3d8._M_unused._M_object = operator_new(0x38);
          *(undefined8 *)local_3d8._M_unused._0_8_ = value.mError._0_8_;
          *(pointer *)((long)local_3d8._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p
          ;
          *(size_type *)((long)local_3d8._M_unused._0_8_ + 0x10) =
               value.mError.mMessage._M_string_length;
          value.mError.mCode = kNone;
          value.mError._4_4_ = 0;
          value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
          value.mError.mMessage._M_string_length = 0;
          *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x18) = 0;
          *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x20) = 0;
          *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x28) = 0;
          *(size_type *)((long)local_3d8._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
          if (value.mData._M_dataplus._M_p != (pointer)0x0) {
            *(ulong *)((long)local_3d8._M_unused._0_8_ + 0x18) =
                 CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                          value.mError.mMessage.field_2._M_local_buf[0]);
            *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x20) =
                 value.mError.mMessage.field_2._8_8_;
            *(pointer *)((long)local_3d8._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
            value.mData._M_dataplus._M_p = (pointer)0x0;
            value.mData._M_string_length = 0;
          }
          this_05 = &local_3d8;
          local_3d8._8_8_ =
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          local_3c8 = std::_Function_handler::operator_cast_to_Action;
          pcStack_3c0 = std::_Function_handler::operator_cast_to_Action;
          std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
          anon_func::Op::~Op((Op *)&value);
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          ::WillOnce(this_02,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                              *)this_05);
          std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_408._M_impl.super__Vector_impl_data._M_finish);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
          std::__cxx11::string::~string((string *)&local_180);
          std::
          _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
          ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                          *)&gtest_ar.message_);
          testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                    ((MatcherBase<const_ot::commissioner::Config_&> *)&local_3b8);
          testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
          ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                       &local_398);
          gtest_ar_._0_8_ =
               CommissionerAppMock::gmock_IsActive
                         ((MockSpec<bool_()> *)
                          commissionerAppMock.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,(CommissionerAppMock *)this_05);
          testing::internal::GetWithoutMatchers();
          pTVar2 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                             ((MockSpec<bool_()> *)&gtest_ar_,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,3000,"*commissionerAppMock","IsActive()");
          testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)&expr,false);
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<bool_()> *)&value,(ReturnAction *)&expr);
          pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce
                             (pTVar2,(Action<bool_()> *)&value);
          testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)local_488,true);
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<bool_()> *)&gtest_ar,(ReturnAction *)local_488);
          testing::internal::TypedExpectation<bool_()>::WillOnce
                    (pTVar2,(Action<bool_()> *)&gtest_ar);
          std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8));
          std::_Function_base::~_Function_base((_Function_base *)&value);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          this_00 = commissionerAppMock.
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          testing::A<ot::commissioner::ActiveOperationalDataset_const&>();
          CommissionerAppMock::gmock_SetActiveDataset
                    ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      *)&value,this_00,
                     (Matcher<const_ot::commissioner::ActiveOperationalDataset_&> *)&gtest_ar_);
          testing::internal::GetWithoutMatchers();
          this_03 = testing::internal::
                    MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                    ::InternalExpectedAt
                              ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                *)&value,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xbb9,"*commissionerAppMock","SetActiveDataset(_)");
          local_1b0._0_4_ = kNone;
          local_1a8._M_p = (pointer)&local_198;
          local_1a0 = 0;
          local_198._M_local_buf[0] = '\0';
          testing::Return<ot::commissioner::Error>((testing *)&expr,(Error *)local_1b0);
          testing::internal::ReturnAction::operator_cast_to_Action
                    ((Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      *)&gtest_ar,(ReturnAction *)&expr);
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
          ::WillOnce(this_03,(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                              *)&gtest_ar);
          std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          std::__cxx11::string::~string((string *)&local_1a8);
          testing::internal::MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&>::
          ~MatcherBase((MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&> *)
                       &value.mError.mMessage);
          testing::internal::MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&>::
          ~MatcherBase((MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&> *)&gtest_ar_
                      );
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
          std::__cxx11::string::string
                    ((string *)&gtest_ar,"start --nwk net1",(allocator *)local_488);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&gtest_ar);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&gtest_ar);
          ot::commissioner::Interpreter::Eval((Value *)&gtest_ar,&ctx.mInterpreter,&expr);
          bVar1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar);
          gtest_ar_.success_ = bVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)local_488);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false","true",
                       expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xbbe,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_488);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((long *)local_488._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_488._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                    ((MultiNetCommandContext *)&ctx);
          ot::commissioner::JobManager::CleanupJobs
                    (ctx.mInterpreter.mJobManager.
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::__cxx11::string::string
                    ((string *)&gtest_ar_,"opdataset set active --nwk net1 --import ",
                     (allocator *)local_448._M_pod_data);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_,&mepdsFileName);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)local_488,&ctx.mInterpreter,(string *)&gtest_ar);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_488);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_488);
          std::__cxx11::string::~string((string *)&gtest_ar);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          ot::commissioner::Interpreter::Eval((Value *)&gtest_ar,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar);
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar);
          bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.success_ = bVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!bVar1) {
            testing::Message::Message((Message *)local_488);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xbc4,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_488);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((long *)local_488._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_488._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          unlink(mepdsFileName._M_dataplus._M_p);
          ot::commissioner::Interpreter::Value::~Value(&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&expr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_0017ef59;
        }
        testing::Message::Message((Message *)&value);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xbb2,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&value);
        this_04 = (string *)&gtest_ar_2.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_04);
LAB_0017ef59:
  std::__cxx11::string::~string((string *)&mepdsFileName);
  std::__cxx11::string::~string((string *)&multiEntryPendingDataset);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_MultiEntryImportExplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
  \"1122334455667788\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  },\n\
  \"99AABBCCDDEEFF00\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n\
    \"NetworkName\": \"net9\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, IsActive()).WillOnce(Return(false)).WillOnce(Return(true));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start --nwk net1");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --nwk net1 --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}